

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_make_params
              (mbedtls_dhm_context *ctx,int x_size,uchar *output,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t buflen;
  size_t buflen_00;
  size_t buflen_01;
  uchar *puVar2;
  uchar *p;
  size_t n3;
  size_t n2;
  size_t n1;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t *olen_local;
  uchar *output_local;
  int x_size_local;
  mbedtls_dhm_context *ctx_local;
  
  n1._0_4_ = 0;
  iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0);
  if (iVar1 == 0) {
    ctx_local._4_4_ = -0x3080;
  }
  else {
    do {
      mbedtls_mpi_fill_random(&ctx->X,(long)x_size,f_rng,p_rng);
      while (iVar1 = mbedtls_mpi_cmp_mpi(&ctx->X,&ctx->P), -1 < iVar1) {
        n1._4_4_ = mbedtls_mpi_shift_r(&ctx->X,1);
        if (n1._4_4_ != 0) goto LAB_0018ec2e;
      }
      if (10 < (int)n1) {
        return -0x3180;
      }
      iVar1 = dhm_check_range(&ctx->X,&ctx->P);
      n1._0_4_ = (int)n1 + 1;
    } while (iVar1 != 0);
    n1._4_4_ = mbedtls_mpi_exp_mod(&ctx->GX,&ctx->G,&ctx->X,&ctx->P,&ctx->RP);
    if (n1._4_4_ == 0) {
      iVar1 = dhm_check_range(&ctx->GX,&ctx->P);
      if (iVar1 != 0) {
        return iVar1;
      }
      buflen = mbedtls_mpi_size(&ctx->P);
      buflen_00 = mbedtls_mpi_size(&ctx->G);
      buflen_01 = mbedtls_mpi_size(&ctx->GX);
      n1._4_4_ = mbedtls_mpi_write_binary(&ctx->P,output + 2,buflen);
      if (n1._4_4_ == 0) {
        *output = (uchar)(buflen >> 8);
        output[1] = (uchar)buflen;
        puVar2 = output + buflen + 2;
        n1._4_4_ = mbedtls_mpi_write_binary(&ctx->G,puVar2 + 2,buflen_00);
        if (n1._4_4_ == 0) {
          *puVar2 = (uchar)(buflen_00 >> 8);
          puVar2[1] = (uchar)buflen_00;
          puVar2 = puVar2 + buflen_00 + 2;
          n1._4_4_ = mbedtls_mpi_write_binary(&ctx->GX,puVar2 + 2,buflen_01);
          if (n1._4_4_ == 0) {
            *puVar2 = (uchar)(buflen_01 >> 8);
            puVar2[1] = (uchar)buflen_01;
            *olen = (size_t)(puVar2 + ((buflen_01 + 2) - (long)output));
            ctx->len = buflen;
          }
        }
      }
    }
LAB_0018ec2e:
    if (n1._4_4_ == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = n1._4_4_ + -0x3180;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_dhm_make_params( mbedtls_dhm_context *ctx, int x_size,
                     unsigned char *output, size_t *olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret, count = 0;
    size_t n1, n2, n3;
    unsigned char *p;

    if( mbedtls_mpi_cmp_int( &ctx->P, 0 ) == 0 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    /*
     * Generate X as large as possible ( < P )
     */
    do
    {
        mbedtls_mpi_fill_random( &ctx->X, x_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &ctx->X, &ctx->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &ctx->X, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED );
    }
    while( dhm_check_range( &ctx->X, &ctx->P ) != 0 );

    /*
     * Calculate GX = G^X mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->GX, &ctx->G, &ctx->X,
                          &ctx->P , &ctx->RP ) );

    if( ( ret = dhm_check_range( &ctx->GX, &ctx->P ) ) != 0 )
        return( ret );

    /*
     * export P, G, GX
     */
#define DHM_MPI_EXPORT(X,n)                     \
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( X, p + 2, n ) ); \
    *p++ = (unsigned char)( n >> 8 );           \
    *p++ = (unsigned char)( n      ); p += n;

    n1 = mbedtls_mpi_size( &ctx->P  );
    n2 = mbedtls_mpi_size( &ctx->G  );
    n3 = mbedtls_mpi_size( &ctx->GX );

    p = output;
    DHM_MPI_EXPORT( &ctx->P , n1 );
    DHM_MPI_EXPORT( &ctx->G , n2 );
    DHM_MPI_EXPORT( &ctx->GX, n3 );

    *olen  = p - output;

    ctx->len = n1;

cleanup:

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED + ret );

    return( 0 );
}